

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reoProfile.c
# Opt level: O1

void reoProfileWidthStart(reo_man *p)

{
  size_t __size;
  undefined2 uVar1;
  undefined2 uVar2;
  uint uVar3;
  int iVar4;
  reo_plane *prVar5;
  reo_unit **pprVar6;
  reo_unit *prVar7;
  bool bVar8;
  int *__s;
  int *__s_00;
  ulong uVar9;
  long lVar10;
  reo_unit *prVar11;
  short *psVar12;
  long lVar13;
  
  uVar3 = p->nSupp;
  __size = (long)(int)uVar3 * 4 + 4;
  __s = (int *)malloc(__size);
  __s_00 = (int *)malloc(__size);
  memset(__s,0,__size);
  memset(__s_00,0,__size);
  if (-1 < (long)(int)uVar3) {
    prVar5 = p->pPlanes;
    lVar10 = 0;
    do {
      for (prVar11 = prVar5[lVar10].pHead; prVar11 != (reo_unit *)0x0; prVar11 = prVar11->Next) {
        prVar11->TopRef = 30000;
        prVar11->Sign = 0;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != (ulong)uVar3 + 1);
  }
  iVar4 = p->nTops;
  if (0 < (long)iVar4) {
    pprVar6 = p->pTops;
    lVar10 = 0;
    do {
      psVar12 = (short *)((ulong)pprVar6[lVar10] & 0xfffffffffffffffe);
      if (psVar12[1] == 30000) {
        psVar12[1] = 0;
        *__s = *__s + 1;
        if ((long)*psVar12 != 30000) {
          __s_00[(long)*psVar12 + 1] = __s_00[(long)*psVar12 + 1] + 1;
        }
      }
      lVar10 = lVar10 + 1;
    } while (iVar4 != lVar10);
  }
  if (0 < (int)uVar3) {
    prVar5 = p->pPlanes;
    uVar9 = 0;
    do {
      for (prVar11 = prVar5[uVar9].pHead; prVar11 != (reo_unit *)0x0; prVar11 = prVar11->Next) {
        prVar7 = prVar11->pE;
        if (prVar7->TopRef == 30000) {
          uVar1 = prVar11->lev;
          prVar7->TopRef = uVar1 + 1;
          __s[(short)(uVar1 + 1)] = __s[(short)(uVar1 + 1)] + 1;
          if ((long)prVar7->lev != 30000) {
            __s_00[(long)prVar7->lev + 1] = __s_00[(long)prVar7->lev + 1] + 1;
          }
        }
        prVar7 = prVar11->pT;
        if (prVar7->TopRef == 30000) {
          uVar2 = prVar11->lev;
          prVar7->TopRef = uVar2 + 1;
          __s[(short)(uVar2 + 1)] = __s[(short)(uVar2 + 1)] + 1;
          if ((long)prVar7->lev != 30000) {
            __s_00[(long)prVar7->lev + 1] = __s_00[(long)prVar7->lev + 1] + 1;
          }
        }
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != uVar3);
  }
  if (0 < p->nSupp) {
    lVar13 = 0;
    lVar10 = 0;
    do {
      reoProfileWidthVerifyLevel((reo_plane *)((long)&p->pPlanes->fSifted + lVar13),(int)lVar10);
      lVar10 = lVar10 + 1;
      lVar13 = lVar13 + 0x38;
    } while (lVar10 < p->nSupp);
  }
  p->nWidthCur = 0;
  if (-1 < p->nSupp) {
    lVar10 = 8;
    uVar9 = 0;
    do {
      if (uVar9 == 0) {
        p->pPlanes->statsWidth = *__s - *__s_00;
      }
      else {
        *(int *)((long)&p->pPlanes->fSifted + lVar10) =
             (__s[uVar9] + *(int *)((long)&p->pPlanes[-1].fSifted + lVar10)) - __s_00[uVar9];
      }
      iVar4 = *(int *)((long)&p->pPlanes->fSifted + lVar10);
      *(double *)((long)&p->pPlanes->statsApl + lVar10) = (double)iVar4;
      p->nWidthCur = p->nWidthCur + iVar4;
      printf("Level %2d: Width = %5d.\n",uVar9 & 0xffffffff);
      lVar10 = lVar10 + 0x38;
      bVar8 = (long)uVar9 < (long)p->nSupp;
      uVar9 = uVar9 + 1;
    } while (bVar8);
  }
  p->nWidthBeg = p->nWidthCur;
  if (__s != (int *)0x0) {
    free(__s);
  }
  if (__s_00 != (int *)0x0) {
    free(__s_00);
    return;
  }
  return;
}

Assistant:

void reoProfileWidthStart( reo_man * p )
{
    reo_unit * pUnit;
    int * pWidthStart;
    int * pWidthStop;
    int v;

    // allocate and clean the storage for starting and stopping levels
    pWidthStart = ABC_ALLOC( int, p->nSupp + 1 );
    pWidthStop  = ABC_ALLOC( int, p->nSupp + 1 );
    memset( pWidthStart, 0, sizeof(int) * (p->nSupp + 1) );
    memset( pWidthStop, 0, sizeof(int) * (p->nSupp + 1) );

    // go through the non-constant nodes and set the topmost level of their cofactors
    for ( v = 0; v <= p->nSupp; v++ )
    for ( pUnit = p->pPlanes[v].pHead; pUnit; pUnit = pUnit->Next )
    {
        pUnit->TopRef = REO_TOPREF_UNDEF;
        pUnit->Sign   = 0;
    }

    // add the topmost level of the width profile
    for ( v = 0; v < p->nTops; v++ )
    {
        pUnit = Unit_Regular(p->pTops[v]);
        if ( pUnit->TopRef == REO_TOPREF_UNDEF )
        {
            // set the starting level
            pUnit->TopRef = 0;
            pWidthStart[pUnit->TopRef]++;
            // set the stopping level
            if ( pUnit->lev != REO_CONST_LEVEL )
                pWidthStop[pUnit->lev+1]++;
        }
    }

    for ( v = 0; v < p->nSupp; v++ )
    for ( pUnit = p->pPlanes[v].pHead; pUnit; pUnit = pUnit->Next )
    {
        if ( pUnit->pE->TopRef == REO_TOPREF_UNDEF )
        {
            // set the starting level
            pUnit->pE->TopRef = pUnit->lev + 1;
            pWidthStart[pUnit->pE->TopRef]++;
            // set the stopping level
            if ( pUnit->pE->lev != REO_CONST_LEVEL )
                pWidthStop[pUnit->pE->lev+1]++;
        }
        if ( pUnit->pT->TopRef == REO_TOPREF_UNDEF )
        {
            // set the starting level
            pUnit->pT->TopRef = pUnit->lev + 1;
            pWidthStart[pUnit->pT->TopRef]++;
            // set the stopping level
            if ( pUnit->pT->lev != REO_CONST_LEVEL )
                pWidthStop[pUnit->pT->lev+1]++;
        }
    }

    // verify the top reference
    for ( v = 0; v < p->nSupp; v++ )
        reoProfileWidthVerifyLevel( p->pPlanes + v, v );

    // derive the profile
    p->nWidthCur = 0;
    for ( v = 0; v <= p->nSupp; v++ )
    {
        if ( v == 0 )
            p->pPlanes[v].statsWidth = pWidthStart[v] - pWidthStop[v];
        else
            p->pPlanes[v].statsWidth = p->pPlanes[v-1].statsWidth + pWidthStart[v] - pWidthStop[v];
        p->pPlanes[v].statsCost = p->pPlanes[v].statsWidth;
        p->nWidthCur += p->pPlanes[v].statsWidth;
        printf( "Level %2d: Width = %5d.\n", v, p->pPlanes[v].statsWidth );
    }
    p->nWidthBeg = p->nWidthCur;
    ABC_FREE( pWidthStart );
    ABC_FREE( pWidthStop );
}